

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O2

Am_Value cycle_value_get_string_proc(Am_Object *self)

{
  unsigned_short uVar1;
  uint value;
  Am_Value *pAVar2;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Object *in_RSI;
  Am_Value AVar3;
  Am_Value v;
  Am_Value_List labels;
  
  *(undefined2 *)&self->data = 0;
  self[1].data = (Am_Object_Data *)0x0;
  pAVar2 = Am_Object::Get(in_RSI,0x1aa,0);
  Am_Value_List::Am_Value_List(&labels,pAVar2);
  v.type = 0;
  v.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar2 = Am_Object::Get(in_RSI,0x169,1);
  Am_Value::operator=(&v,pAVar2);
  if (v.type == 2) {
    value = Am_Value::operator_cast_to_int(&v);
    Am_Object::Set(in_RSI,0x1d4,value,0);
    if (-1 < (int)value) {
      uVar1 = Am_Value_List::Length(&labels);
      if (value < uVar1) {
        pAVar2 = Am_Value_List::Get_Nth(&labels,value);
        Am_Value::operator=((Am_Value *)self,pAVar2);
        goto LAB_00243b5c;
      }
    }
    Am_Value::operator=((Am_Value *)self,"**ERROR**");
  }
LAB_00243b5c:
  Am_Value::~Am_Value(&v);
  Am_Value_List::~Am_Value_List(&labels);
  AVar3.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar3._0_8_ = self;
  return AVar3;
}

Assistant:

Am_Define_Formula(Am_Value, cycle_value_get_string)
{
  Am_Value value;
  Am_Value_List labels = self.Get(Am_LABEL_LIST);
  Am_Value v;
  v = self.Peek(Am_VALUE);
  if (v.type == Am_INT) {
    int cur_val = v;
    self.Set(Am_COMPUTE_INTER_VALUE, cur_val); //keep consistent with value
    if (cur_val < 0 || cur_val >= labels.Length()) {
      value = "**ERROR**";
    } else
      value = labels.Get_Nth(cur_val);
  }
  return value;
}